

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_equalp_bound(sexp ctx,sexp self,sexp_sint_t n,sexp a,sexp b,sexp depth,sexp bound)

{
  void *__s1;
  void *__s2;
  uint uVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  sexp_sint_t sVar6;
  size_t __n;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  anon_union_24768_35_b8e82fc1_for_value *paVar11;
  bool bVar12;
  
  if (a == b) {
    return bound;
  }
  while (((a != (sexp)0x0 && (b != (sexp)0x0)) && ((((uint)a | (uint)b) & 3) == 0))) {
    uVar1 = a->tag;
    if (uVar1 != b->tag) break;
    if ((ulong)uVar1 == 0xb) {
      bVar12 = (a->value).type.name == (b->value).type.name;
LAB_00110546:
      if (bVar12) {
        return bound;
      }
      return (sexp)&DAT_0000003e;
    }
    if (uVar1 == 0xc) {
      sVar6 = sexp_bignum_compare(a,b);
      bVar12 = sVar6 == 0;
      goto LAB_00110546;
    }
    if ((long)depth < 0) {
      return bound;
    }
    if ((long)bound < 0) {
      return bound;
    }
    lVar2 = *(long *)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                     (ulong)uVar1 * 8 + 8);
    lVar9 = (long)*(short *)(lVar2 + 0x54);
    paVar11 = (anon_union_24768_35_b8e82fc1_for_value *)((long)&b->tag + lVar9);
    bVar12 = lVar9 == 0;
    if (bVar12) {
      lVar9 = 8;
    }
    if (bVar12) {
      paVar11 = &b->value;
    }
    if ((lVar9 != 8) && (iVar5 = bcmp(&a->value,&b->value,lVar9 - 8), iVar5 != 0)) break;
    lVar7 = *(long *)((long)&a->tag + (long)*(short *)(lVar2 + 0x5a)) *
            (ulong)*(ushort *)(lVar2 + 0x5c);
    __s1 = (void *)((long)&a->tag + (lVar7 + *(short *)(lVar2 + 0x58)) * 8 + lVar9);
    __n = (long)a + ((*(long *)((long)&a->tag + (long)*(short *)(lVar2 + 0x60)) *
                      (ulong)*(ushort *)(lVar2 + 0x62) + (long)*(short *)(lVar2 + 0x5e)) -
                    (long)__s1);
    if ((__n != 0) &&
       ((__s2 = (void *)((long)paVar11 +
                        ((ulong)*(ushort *)(lVar2 + 0x5c) *
                         *(long *)((long)&b->tag + (long)*(short *)(lVar2 + 0x5a)) +
                        (long)*(short *)(lVar2 + 0x58)) * 8),
        __n != (long)b + (((ulong)*(ushort *)(lVar2 + 0x62) *
                           *(long *)((long)&b->tag + (long)*(short *)(lVar2 + 0x60)) +
                          (long)*(short *)(lVar2 + 0x5e)) - (long)__s2) ||
        (iVar5 = bcmp(__s1,__s2,__n), iVar5 != 0)))) break;
    bound = (sexp)((long)&bound[-1].value + 0x60be);
    uVar8 = lVar7 + *(short *)(lVar2 + 0x56);
    if ((long)uVar8 < 1) {
      return bound;
    }
    do {
      if ((long)uVar8 < 2) {
        uVar10 = 0;
        goto LAB_001104fa;
      }
      uVar10 = uVar8 - 1;
      piVar3 = *(int **)((long)a + uVar8 * 8 + lVar9 + -8);
      piVar4 = *(int **)((long)paVar11 + uVar8 * 8 + -8);
      uVar8 = uVar10;
    } while (piVar3 == piVar4);
    if ((((piVar3 == (int *)0x0) || (piVar4 == (int *)0x0)) ||
        ((((uint)piVar4 | (uint)piVar3) & 3) != 0)) || (*piVar3 != *piVar4)) break;
    uVar8 = 0;
    do {
      bound = sexp_equalp_bound(ctx,self,n,*(sexp *)((long)&a->tag + uVar8 * 8 + lVar9),
                                *(sexp *)((long)paVar11 + uVar8 * 8),
                                (sexp)((long)&depth[-1].value + 0x60be),bound);
      if (bound == (sexp)&DAT_0000003e) goto LAB_00110517;
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar10);
LAB_001104fa:
    a = *(sexp *)((long)&a->tag + uVar10 * 8 + lVar9);
    b = *(sexp *)((long)paVar11 + uVar10 * 8);
    if (a == b) {
      return bound;
    }
  }
LAB_00110517:
  return (sexp)&DAT_0000003e;
}

Assistant:

sexp sexp_equalp_bound (sexp ctx, sexp self, sexp_sint_t n, sexp a, sexp b, sexp depth, sexp bound) {
  sexp_uint_t left_size, right_size;
  sexp_sint_t i, len;
  sexp t, *p, *q, depth2;
  char *p_left, *p_right, *q_left, *q_right;

 loop:
  if (a == b)
    return bound;
  else if ((!a || !sexp_pointerp(a)) || (!b || !sexp_pointerp(b))
           || (sexp_pointer_tag(a) != sexp_pointer_tag(b)))
    return SEXP_FALSE;

  /* a and b are both pointers of the same type */
#if SEXP_USE_BIGNUMS
  if (sexp_pointer_tag(a) == SEXP_BIGNUM)
    return !sexp_bignum_compare(a, b) ? bound : SEXP_FALSE;
#endif
#if SEXP_USE_FLONUMS && ! SEXP_USE_IMMEDIATE_FLONUMS
  if (sexp_pointer_tag(a) == SEXP_FLONUM)
    return sexp_flonum_eqv(a, b) ? bound : SEXP_FALSE;
#endif
  /* check limits */
  if (sexp_unbox_fixnum(bound) < 0 || sexp_unbox_fixnum(depth) < 0)
    return bound;
  depth2 = sexp_fx_sub(depth, SEXP_ONE);
  bound = sexp_fx_sub(bound, SEXP_ONE);
  t = sexp_object_type(ctx, a);
  p_left = ((char*)a) + offsetof(struct sexp_struct, value);
  p = (sexp*) (((char*)a) + sexp_type_field_base(t));
  q_left = ((char*)b) + offsetof(struct sexp_struct, value);
  q = (sexp*) (((char*)b) + sexp_type_field_base(t));
  /* if no fields, the base is value (just past the header) */
  if ((sexp)p == a) {p=(sexp*)p_left; q=(sexp*)q_left;}
  /* check preliminary non-object data */
  left_size = (char*)p - p_left;
  if ((left_size > 0) && memcmp(p_left, q_left, left_size))
    return SEXP_FALSE;
  /* check trailing non-object data */
  p_right = ((char*)p + sexp_type_num_slots_of_object(t,a)*sizeof(sexp));
  right_size = ((char*)a + sexp_type_size_of_object(t, a)) - p_right;
  if (right_size > 0) {
    q_right = ((char*)q + sexp_type_num_slots_of_object(t,b)*sizeof(sexp));
    if (right_size != ((char*)b + sexp_type_size_of_object(t, b)) - q_right)
      return SEXP_FALSE;
    if (memcmp(p_right, q_right, right_size))
      return SEXP_FALSE;
  }
  /* left and right non-object data is the same, now check eq-object slots */
  len = sexp_type_num_eq_slots_of_object(t, a);
  if (len > 0) {
    for (; len > 1; len--) {
      a = p[len-1]; b = q[len-1];
      if (a != b) {
        if ((!a || !sexp_pointerp(a)) || (!b || !sexp_pointerp(b))
            || (sexp_pointer_tag(a) != sexp_pointer_tag(b)))
          return SEXP_FALSE;
        else break;
      }
    }
    for (i=0; i<len-1; i++) {
      bound = sexp_equalp_bound(ctx, self, n, p[i], q[i], depth2, bound);
      if (sexp_not(bound)) return SEXP_FALSE;
    }
    /* tail-recurse on the last value (same depth) */
    a = p[len-1]; b = q[len-1]; goto loop;
  }
  return bound;
}